

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::coap::Message::GetOption
          (Error *__return_storage_ptr__,Message *this,string *aValue,OptionType aNumber)

{
  size_t **ppsVar1;
  _Base_ptr p_Var2;
  char *pcVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  string_view fmt;
  format_args args;
  OptionType local_aa;
  string local_a8;
  format_string_checker<char> local_88;
  ErrorCode local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  p_Var4 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_aa = aNumber;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var5 = &(this->mOptions)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var5->_M_header;
    do {
      bVar6 = (OptionType)p_Var4[1]._M_color < aNumber;
      if (!bVar6) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var5) && ((OptionType)p_Var2[1]._M_color <= aNumber)) {
      ppsVar1 = (size_t **)
                &local_88.context_.super_basic_format_parse_context<char>.format_str_.size_;
      local_88._0_8_ = ppsVar1;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&local_88,p_Var2[1]._M_parent,p_Var2[1]._M_left);
      std::__cxx11::string::operator=((string *)aValue,(string *)&local_88);
      local_a8._M_dataplus._M_p = (pointer)local_88._0_8_;
      if ((size_t **)local_88._0_8_ == ppsVar1) {
        return __return_storage_ptr__;
      }
      goto LAB_0014a90e;
    }
  }
  local_88.types_[0] = custom_type;
  local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "CoAP option {} not found";
  local_88.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x18;
  local_88.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_88.context_.super_basic_format_parse_context<char>._20_4_ = 1;
  local_88.parse_funcs_[0] =
       ::fmt::v10::detail::
       parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
  ;
  begin = "CoAP option {} not found";
  local_88.context_.types_ = local_88.types_;
  do {
    pcVar3 = begin + 1;
    if (*begin == '}') {
      if ((pcVar3 == "") || (*pcVar3 != '}')) {
        ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
      }
      pcVar3 = begin + 2;
    }
    else if (*begin == '{') {
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                         (begin,"",&local_88);
    }
    begin = pcVar3;
  } while (pcVar3 != "");
  local_88._0_8_ = &local_aa;
  local_88.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       (char *)::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
               format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
  ;
  fmt.size_ = 0xf;
  fmt.data_ = (char *)0x18;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_88;
  ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"CoAP option {} not found",fmt,args);
  local_50 = kNotFound;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  __return_storage_ptr__->mCode = local_50;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return __return_storage_ptr__;
  }
LAB_0014a90e:
  operator_delete(local_a8._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetOption(std::string &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetStringValue();

exit:
    return error;
}